

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_handle_input(amqp_connection_state_t state,amqp_bytes_t received_data,
                     amqp_frame_t *decoded_frame)

{
  amqp_connection_state_enum aVar1;
  undefined4 *puVar2;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  int iVar7;
  size_t sVar8;
  amqp_pool_t *paVar9;
  uint64_t uVar10;
  void *pvVar11;
  byte *in_RCX;
  ulong offset;
  long in_RSI;
  amqp_connection_state_t in_RDI;
  amqp_pool_t *unaff_retaddr;
  uint16_t in_stack_0000000e;
  amqp_pool_t *channel_pool_1;
  int res;
  amqp_bytes_t encoded;
  amqp_pool_t *channel_pool;
  amqp_channel_t channel;
  void *raw_frame;
  size_t bytes_consumed;
  void **in_stack_000002a8;
  amqp_pool_t *in_stack_000002b0;
  amqp_method_number_t in_stack_000002bc;
  amqp_bytes_t in_stack_000002c0;
  amqp_bytes_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 uVar12;
  undefined2 in_stack_ffffffffffffff96;
  amqp_channel_t channel_00;
  amqp_connection_state_t in_stack_ffffffffffffff98;
  int *local_38;
  int local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  *in_RCX = 0;
  if (in_RSI == 0) {
    return 0;
  }
  if (in_RDI->state == CONNECTION_STATE_IDLE) {
    in_RDI->state = CONNECTION_STATE_HEADER;
  }
  sVar8 = consume_data((amqp_connection_state_t)
                       CONCAT26(in_stack_ffffffffffffff96,
                                CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
                       in_stack_ffffffffffffff88);
  local_30 = (int)sVar8;
  if (in_RDI->inbound_offset < in_RDI->target_size) {
    return local_30;
  }
  local_38 = (int *)(in_RDI->inbound_buffer).bytes;
  aVar1 = in_RDI->state;
  uVar12 = (undefined2)aVar1;
  channel_00 = (amqp_channel_t)(aVar1 >> 0x10);
  if (aVar1 == CONNECTION_STATE_INITIAL) {
    if (*local_38 == 0x50514d41) {
      *in_RCX = 0x41;
      in_RCX[2] = 0;
      in_RCX[3] = 0;
      bVar4 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                      (size_t)in_stack_ffffffffffffff88);
      in_RCX[8] = bVar4;
      bVar4 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                      (size_t)in_stack_ffffffffffffff88);
      in_RCX[9] = bVar4;
      bVar4 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                      (size_t)in_stack_ffffffffffffff88);
      in_RCX[10] = bVar4;
      bVar4 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                      (size_t)in_stack_ffffffffffffff88);
      in_RCX[0xb] = bVar4;
      return_to_idle(in_RDI);
      return local_30;
    }
LAB_001108d2:
    amqp_d16((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
             (size_t)in_stack_ffffffffffffff88);
    uVar6 = amqp_d32((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                     (size_t)in_stack_ffffffffffffff88);
    in_RDI->target_size = (ulong)(uVar6 + 8);
    if ((ulong)(long)in_RDI->frame_max < in_RDI->target_size) {
      return -2;
    }
    paVar9 = amqp_get_or_create_channel_pool(in_stack_ffffffffffffff98,channel_00);
    if (paVar9 == (amqp_pool_t *)0x0) {
      return -1;
    }
    amqp_pool_alloc_bytes
              ((amqp_pool_t *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
               (size_t)in_stack_ffffffffffffff88,(amqp_bytes_t *)0x11097e);
    if ((in_RDI->inbound_buffer).bytes == (void *)0x0) {
      return -1;
    }
    puVar2 = (undefined4 *)(in_RDI->inbound_buffer).bytes;
    *puVar2 = *(undefined4 *)in_RDI->header_buffer;
    *(undefined2 *)(puVar2 + 1) = *(undefined2 *)(in_RDI->header_buffer + 4);
    *(char *)((long)puVar2 + 6) = in_RDI->header_buffer[6];
    local_38 = (int *)(in_RDI->inbound_buffer).bytes;
    in_RDI->state = CONNECTION_STATE_BODY;
    sVar8 = consume_data((amqp_connection_state_t)
                         CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                         in_stack_ffffffffffffff88);
    local_30 = (int)sVar8 + local_30;
    if (in_RDI->inbound_offset < in_RDI->target_size) {
      return local_30;
    }
  }
  else {
    if (aVar1 == CONNECTION_STATE_HEADER) goto LAB_001108d2;
    if (aVar1 != CONNECTION_STATE_BODY) {
      amqp_abort("Internal error: invalid amqp_connection_state_t->state %d",(ulong)in_RDI->state);
    }
  }
  uVar3 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                  (size_t)in_stack_ffffffffffffff88);
  if (uVar3 != 0xce) {
    return -2;
  }
  bVar4 = amqp_d8((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                  (size_t)in_stack_ffffffffffffff88);
  *in_RCX = bVar4;
  uVar5 = amqp_d16((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),
                   (size_t)in_stack_ffffffffffffff88);
  *(uint16_t *)(in_RCX + 2) = uVar5;
  paVar9 = amqp_get_or_create_channel_pool(in_stack_ffffffffffffff98,channel_00);
  if (paVar9 == (amqp_pool_t *)0x0) {
    return -1;
  }
  offset = (ulong)(*in_RCX - 1);
  switch(offset) {
  case 0:
    uVar6 = amqp_d32((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),offset)
    ;
    *(uint32_t *)(in_RCX + 8) = uVar6;
    amqp_offset(local_38,0xb);
    iVar7 = amqp_decode_method(in_stack_000002bc,in_stack_000002b0,in_stack_000002c0,
                               in_stack_000002a8);
    goto joined_r0x00110c2d;
  case 1:
    uVar5 = amqp_d16((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),offset)
    ;
    *(uint16_t *)(in_RCX + 8) = uVar5;
    uVar10 = amqp_d64((void *)CONCAT26(channel_00,CONCAT24(uVar12,in_stack_ffffffffffffff90)),offset
                     );
    *(uint64_t *)(in_RCX + 0x10) = uVar10;
    pvVar11 = amqp_offset(local_38,0x13);
    *(size_t *)(in_RCX + 0x20) = in_RDI->target_size - 0x14;
    *(void **)(in_RCX + 0x28) = pvVar11;
    iVar7 = amqp_decode_properties
                      (in_stack_0000000e,unaff_retaddr,_channel_pool_1,
                       (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
joined_r0x00110c2d:
    if (iVar7 < 0) {
      return iVar7;
    }
    break;
  case 2:
    *(size_t *)(in_RCX + 8) = in_RDI->target_size - 8;
    pvVar11 = amqp_offset(local_38,7);
    *(void **)(in_RCX + 0x10) = pvVar11;
    break;
  default:
    *in_RCX = 0;
    break;
  case 7:
  }
  return_to_idle(in_RDI);
  return local_30;
}

Assistant:

int amqp_handle_input(amqp_connection_state_t state,
                      amqp_bytes_t received_data,
                      amqp_frame_t *decoded_frame)
{
  size_t bytes_consumed;
  void *raw_frame;

  /* Returning frame_type of zero indicates either insufficient input,
     or a complete, ignored frame was read. */
  decoded_frame->frame_type = 0;

  if (received_data.len == 0) {
    return AMQP_STATUS_OK;
  }

  if (state->state == CONNECTION_STATE_IDLE) {
    state->state = CONNECTION_STATE_HEADER;
  }

  bytes_consumed = consume_data(state, &received_data);

  /* do we have target_size data yet? if not, return with the
     expectation that more will arrive */
  if (state->inbound_offset < state->target_size) {
    return bytes_consumed;
  }

  raw_frame = state->inbound_buffer.bytes;

  switch (state->state) {
  case CONNECTION_STATE_INITIAL:
    /* check for a protocol header from the server */
    if (memcmp(raw_frame, "AMQP", 4) == 0) {
      decoded_frame->frame_type = AMQP_PSEUDOFRAME_PROTOCOL_HEADER;
      decoded_frame->channel = 0;

      decoded_frame->payload.protocol_header.transport_high
        = amqp_d8(raw_frame, 4);
      decoded_frame->payload.protocol_header.transport_low
        = amqp_d8(raw_frame, 5);
      decoded_frame->payload.protocol_header.protocol_version_major
        = amqp_d8(raw_frame, 6);
      decoded_frame->payload.protocol_header.protocol_version_minor
        = amqp_d8(raw_frame, 7);

      return_to_idle(state);
      return bytes_consumed;
    }

    /* it's not a protocol header; fall through to process it as a
       regular frame header */

  case CONNECTION_STATE_HEADER: {
    amqp_channel_t channel;
    amqp_pool_t *channel_pool;
    /* frame length is 3 bytes in */
    channel = amqp_d16(raw_frame, 1);

    state->target_size
      = amqp_d32(raw_frame, 3) + HEADER_SIZE + FOOTER_SIZE;

    if ((size_t)state->frame_max < state->target_size) {
      return AMQP_STATUS_BAD_AMQP_DATA;
    }

    channel_pool = amqp_get_or_create_channel_pool(state, channel);
    if (NULL == channel_pool) {
      return AMQP_STATUS_NO_MEMORY;
    }

    amqp_pool_alloc_bytes(channel_pool, state->target_size, &state->inbound_buffer);
    if (NULL == state->inbound_buffer.bytes) {
      return AMQP_STATUS_NO_MEMORY;
    }
    memcpy(state->inbound_buffer.bytes, state->header_buffer, HEADER_SIZE);
    raw_frame = state->inbound_buffer.bytes;

    state->state = CONNECTION_STATE_BODY;

    bytes_consumed += consume_data(state, &received_data);

    /* do we have target_size data yet? if not, return with the
       expectation that more will arrive */
    if (state->inbound_offset < state->target_size) {
      return bytes_consumed;
    }

  }
    /* fall through to process body */

  case CONNECTION_STATE_BODY: {
    amqp_bytes_t encoded;
    int res;
    amqp_pool_t *channel_pool;

    /* Check frame end marker (footer) */
    if (amqp_d8(raw_frame, state->target_size - 1) != AMQP_FRAME_END) {
      return AMQP_STATUS_BAD_AMQP_DATA;
    }

    decoded_frame->frame_type = amqp_d8(raw_frame, 0);
    decoded_frame->channel = amqp_d16(raw_frame, 1);

    channel_pool = amqp_get_or_create_channel_pool(state, decoded_frame->channel);
    if (NULL == channel_pool) {
      return AMQP_STATUS_NO_MEMORY;
    }

    switch (decoded_frame->frame_type) {
    case AMQP_FRAME_METHOD:
      decoded_frame->payload.method.id = amqp_d32(raw_frame, HEADER_SIZE);
      encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 4);
      encoded.len = state->target_size - HEADER_SIZE - 4 - FOOTER_SIZE;

      res = amqp_decode_method(decoded_frame->payload.method.id,
                               channel_pool, encoded,
                               &decoded_frame->payload.method.decoded);
      if (res < 0) {
        return res;
      }

      break;

    case AMQP_FRAME_HEADER:
      decoded_frame->payload.properties.class_id
        = amqp_d16(raw_frame, HEADER_SIZE);
      /* unused 2-byte weight field goes here */
      decoded_frame->payload.properties.body_size
        = amqp_d64(raw_frame, HEADER_SIZE + 4);
      encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 12);
      encoded.len = state->target_size - HEADER_SIZE - 12 - FOOTER_SIZE;
      decoded_frame->payload.properties.raw = encoded;

      res = amqp_decode_properties(decoded_frame->payload.properties.class_id,
                                   channel_pool, encoded,
                                   &decoded_frame->payload.properties.decoded);
      if (res < 0) {
        return res;
      }

      break;

    case AMQP_FRAME_BODY:
      decoded_frame->payload.body_fragment.len
        = state->target_size - HEADER_SIZE - FOOTER_SIZE;
      decoded_frame->payload.body_fragment.bytes
        = amqp_offset(raw_frame, HEADER_SIZE);
      break;

    case AMQP_FRAME_HEARTBEAT:
      break;

    default:
      /* Ignore the frame */
      decoded_frame->frame_type = 0;
      break;
    }

    return_to_idle(state);
    return bytes_consumed;
  }

  default:
    amqp_abort("Internal error: invalid amqp_connection_state_t->state %d", state->state);
    return bytes_consumed;
  }
}